

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * indexed_load(Proc *proc,Pseudo *index_pseudo)

{
  byte *pbVar1;
  uint uVar2;
  ravitype_t rVar3;
  ravitype_t type;
  uint uVar4;
  Pseudo *pPVar5;
  Pseudo *pPVar6;
  C_MemoryAllocator *pCVar7;
  undefined1 *ptr;
  char *ptr_00;
  Pseudo *pPVar8;
  Pseudo *pPVar9;
  char cVar10;
  Pseudo *local_48;
  Pseudo *local_38;
  
  if (((undefined1  [48])*index_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    __assert_fail("index_pseudo->type == PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x524,"Pseudo *indexed_load(Proc *, Pseudo *)");
  }
  if ((undefined1  [40])((undefined1  [40])index_pseudo->field_3 & (undefined1  [40])0x200000000) !=
      (undefined1  [40])0x0) {
    __assert_fail("!index_pseudo->index_info.used",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x525,"Pseudo *indexed_load(Proc *, Pseudo *)");
  }
  if ((undefined1  [40])((undefined1  [40])index_pseudo->field_3 & (undefined1  [40])0x100000000) ==
      (undefined1  [40])0x0) {
    pPVar5 = (index_pseudo->field_3).index_info.container;
    if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x530,"Pseudo *indexed_load(Proc *, Pseudo *)");
    }
    pPVar6 = (index_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*pPVar6 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x531,"Pseudo *indexed_load(Proc *, Pseudo *)");
    }
    uVar2 = (index_pseudo->field_3).range_in_use;
    rVar3 = (index_pseudo->field_3).index_info.key_type;
    if (uVar2 == 0x20) {
      cVar10 = 'V';
    }
    else if (uVar2 == 0x40) {
      cVar10 = 'X';
    }
    else {
      cVar10 = 'P';
      if (uVar2 == 0x80) {
        cVar10 = 'S';
      }
    }
    type = (index_pseudo->field_3).index_info.target_type;
    uVar4 = (index_pseudo->field_3).index_info.line_number;
    if (rVar3 == RAVI_TSTRING) {
      if ((uVar2 == 0x40) || (uVar2 == 0x20)) {
        __assert_fail("container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x547,"Pseudo *indexed_load(Proc *, Pseudo *)");
      }
      cVar10 = cVar10 + '\x02';
    }
    else if (rVar3 == RAVI_TNUMINT) {
      cVar10 = cVar10 + '\x01';
    }
    pCVar7 = proc->linearizer->compiler_state->allocator;
    ptr_00 = (char *)(*pCVar7->calloc)(pCVar7->arena,1,0x28);
    *ptr_00 = cVar10;
    *(uint *)(ptr_00 + 0x20) = uVar4;
    if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      local_48 = indexed_load(proc,pPVar5);
      pPVar9 = local_48;
    }
    else {
      local_48 = (Pseudo *)0x0;
      pPVar9 = pPVar5;
    }
    raviX_ptrlist_add((PtrList **)(ptr_00 + 8),pPVar9,proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*pPVar6 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pPVar8 = indexed_load(proc,pPVar6);
      pPVar9 = pPVar8;
    }
    else {
      pPVar8 = (Pseudo *)0x0;
      pPVar9 = pPVar6;
    }
    raviX_ptrlist_add((PtrList **)(ptr_00 + 8),pPVar9,proc->linearizer->compiler_state->allocator);
    free_temp_pseudo(proc,pPVar5,false);
    free_temp_pseudo(proc,pPVar6,false);
    pbVar1 = (byte *)((long)&index_pseudo->field_3 + 0xc);
    *pbVar1 = *pbVar1 | 2;
    if (local_48 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,local_48,false);
    }
    if (pPVar8 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar8,false);
    }
    pPVar9 = allocate_temp_pseudo(proc,type,true);
    if (((undefined1  [48])*pPVar9 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
LAB_001197e4:
      __assert_fail("pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
    }
    raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),pPVar9,proc->linearizer->compiler_state->allocator
                     );
    if ((*(BasicBlock **)(ptr_00 + 0x18) != (BasicBlock *)0x0) &&
       (*(BasicBlock **)(ptr_00 + 0x18) != proc->current_bb)) {
LAB_00119803:
      __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x1b1,"void add_instruction(Proc *, Instruction *)");
    }
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_00,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
  }
  else {
    pPVar5 = (index_pseudo->field_3).index_info.container;
    if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x50e,"Pseudo *indexed_load_from_global(Proc *, Pseudo *)");
    }
    pPVar6 = (index_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*pPVar6 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x50f,"Pseudo *indexed_load_from_global(Proc *, Pseudo *)");
    }
    pPVar9 = allocate_temp_pseudo(proc,RAVI_TANY,true);
    uVar2 = (index_pseudo->field_3).index_info.line_number;
    pCVar7 = proc->linearizer->compiler_state->allocator;
    ptr = (undefined1 *)(*pCVar7->calloc)(pCVar7->arena,1,0x28);
    *ptr = 0x3a;
    *(uint *)(ptr + 0x20) = uVar2;
    if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      local_38 = indexed_load(proc,pPVar5);
      pPVar8 = local_38;
    }
    else {
      local_38 = (Pseudo *)0x0;
      pPVar8 = pPVar5;
    }
    raviX_ptrlist_add((PtrList **)(ptr + 8),pPVar8,proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*pPVar6 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      local_48 = indexed_load(proc,pPVar6);
      pPVar8 = local_48;
    }
    else {
      local_48 = (Pseudo *)0x0;
      pPVar8 = pPVar6;
    }
    raviX_ptrlist_add((PtrList **)(ptr + 8),pPVar8,proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*pPVar9 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
    goto LAB_001197e4;
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),pPVar9,proc->linearizer->compiler_state->allocator);
    if ((*(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) &&
       (*(BasicBlock **)(ptr + 0x18) != proc->current_bb)) goto LAB_00119803;
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
    free_temp_pseudo(proc,pPVar5,false);
    free_temp_pseudo(proc,pPVar6,false);
    pbVar1 = (byte *)((long)&index_pseudo->field_3 + 0xc);
    *pbVar1 = *pbVar1 | 2;
    if (local_38 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,local_38,false);
    }
    if (local_48 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,local_48,false);
    }
  }
  return pPVar9;
}

Assistant:

static Pseudo *indexed_load(Proc *proc, Pseudo *index_pseudo)
{
	assert(index_pseudo->type == PSEUDO_INDEXED);
	assert(!index_pseudo->index_info.used);
	if (index_pseudo->index_info.is_global)
		return indexed_load_from_global(proc, index_pseudo);

	ravitype_t container_type = index_pseudo->index_info.container_type;
	ravitype_t key_type = index_pseudo->index_info.key_type;
	ravitype_t target_type = index_pseudo->index_info.target_type;
	unsigned line_number = index_pseudo->index_info.line_number;
	Pseudo *container_pseudo = index_pseudo->index_info.container;
	Pseudo *key_pseudo = index_pseudo->index_info.key;

	assert(container_pseudo->type != PSEUDO_INDEXED);
	assert(key_pseudo->type != PSEUDO_INDEXED);

	int op = op_get;
	switch (container_type) {
	case RAVI_TTABLE:
		op = op_tget;
		break;
	case RAVI_TARRAYINT:
		op = op_iaget;
		break;
	case RAVI_TARRAYFLT:
		op = op_faget;
		break;
	default:
		break;
	}
	/* Note we rely upon ordering of enums here */
	switch (key_type) {
	case RAVI_TNUMINT:
		op++;
		break;
	case RAVI_TSTRING:
		assert(container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT);
		op += 2;
		break;
	default:
		break;
	}
	Instruction *insn = allocate_instruction(proc, (enum opcode)op, line_number);
	Pseudo *tofree1 = add_instruction_operand(proc, insn, container_pseudo);
	Pseudo *tofree2 = add_instruction_operand(proc, insn, key_pseudo);
	free_temp_pseudo(proc, container_pseudo, false);
	free_temp_pseudo(proc, key_pseudo, false);
	index_pseudo->index_info.used = 1;
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	Pseudo *target_pseudo = allocate_temp_pseudo(proc, target_type, true);
	add_instruction_target(proc, insn, target_pseudo);
	add_instruction(proc, insn);
	return target_pseudo;
}